

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<float,_duckdb::ModeStandard<float>_>::ModeAdd
          (ModeState<float,_duckdb::ModeStandard<float>_> *this,idx_t row)

{
  ColumnDataScanState *pCVar1;
  size_t sVar2;
  reference pvVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  float *pfVar6;
  ulong uVar7;
  key_type *__k;
  
  pCVar1 = this->scan;
  if ((pCVar1->next_row_index <= row) || (uVar4 = pCVar1->current_row_index, row < uVar4)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)row,(DataChunk *)pCVar1);
    pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(float **)(pvVar3 + 0x20);
    pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar3);
    this->validity = (ValidityMask *)(pvVar3 + 0x28);
    uVar4 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)row - (int)uVar4);
  pmVar5 = std::__detail::
           _Map_base<float,_std::pair<const_float,_duckdb::ModeAttr>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<float,_std::pair<const_float,_duckdb::ModeAttr>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar2 = pmVar5->count;
  uVar4 = sVar2 + 1;
  pmVar5->count = uVar4;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar5->first_row = row;
  }
  else {
    uVar7 = pmVar5->first_row;
    if (row < pmVar5->first_row) {
      uVar7 = row;
    }
    pmVar5->first_row = uVar7;
  }
  if (this->count < uVar4) {
    this->valid = true;
    this->count = uVar4;
    if (this->mode == (float *)0x0) {
      pfVar6 = (float *)operator_new(4);
      *pfVar6 = *__k;
      this->mode = pfVar6;
    }
    else {
      *this->mode = *__k;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}